

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinAnalytic_fp.c
# Opt level: O2

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  double dVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  void *returnvalue;
  void *returnvalue_00;
  void *returnvalue_01;
  undefined8 *returnvalue_02;
  double *returnvalue_03;
  long lVar7;
  char *pcVar8;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  uint local_ac;
  FILE *local_a8;
  uint local_9c;
  double local_98;
  double dStack_90;
  undefined8 local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  long local_70;
  long local_68;
  SUNContext sunctx;
  double local_58;
  undefined8 uStack_50;
  void *kmem;
  long nni;
  long nfe;
  
  local_ac = 0;
  iVar5 = check_retval(&local_ac,"SetDefaults",1);
  uVar6 = 1;
  if (iVar5 == 0) {
    local_88._0_4_ = 0;
    local_88._4_4_ = 0x3eb90000;
    uStack_80 = 0;
    uStack_7c = 0;
    local_58 = 1.48219693752374e-322;
    local_98 = 1.0;
    local_9c = 0;
    local_a8 = (FILE *)0x3ff0000000000000;
    local_68 = 0;
    local_70 = 0;
    for (lVar7 = 1; lVar7 < argc; lVar7 = lVar7 + 2) {
      pcVar8 = argv[lVar7];
      iVar5 = strcmp(pcVar8,"--tol");
      if (iVar5 == 0) {
        dVar2 = atof(argv[lVar7 + 1]);
        local_88._0_4_ = SUB84(dVar2,0);
        local_88._4_4_ = (undefined4)((ulong)dVar2 >> 0x20);
        uStack_80 = extraout_XMM0_Dc;
        uStack_7c = extraout_XMM0_Dd;
        goto LAB_001014da;
      }
      iVar5 = strcmp(pcVar8,"--maxiter");
      if (iVar5 == 0) {
        iVar5 = atoi(argv[lVar7 + 1]);
        local_58 = (double)(long)iVar5;
LAB_001014c8:
      }
      else {
        iVar5 = strcmp(pcVar8,"--m_aa");
        if (iVar5 == 0) {
          iVar5 = atoi(argv[lVar7 + 1]);
          local_70 = (long)iVar5;
          goto LAB_001014c8;
        }
        iVar5 = strcmp(pcVar8,"--delay_aa");
        if (iVar5 == 0) {
          iVar5 = atoi(argv[lVar7 + 1]);
          local_68 = (long)iVar5;
          goto LAB_001014c8;
        }
        iVar5 = strcmp(pcVar8,"--damping_fp");
        if (iVar5 == 0) {
          local_98 = atof(argv[lVar7 + 1]);
        }
        else {
          iVar5 = strcmp(pcVar8,"--damping_aa");
          if (iVar5 != 0) {
            iVar5 = strcmp(pcVar8,"--orth_aa");
            if (iVar5 == 0) {
              local_9c = atoi(argv[lVar7 + 1]);
              goto LAB_001014c8;
            }
            iVar5 = strcmp(pcVar8,"--help");
            if (iVar5 != 0) {
              printf("Error: Invalid command line parameter %s\n",pcVar8);
            }
            putchar(10);
            puts(" Command line options:");
            puts("   --tol        : nonlinear solver tolerance");
            puts("   --maxiter    : max number of nonlinear iterations");
            puts("   --m_aa       : number of Anderson acceleration vectors");
            puts("   --delay_aa   : Anderson acceleration delay");
            puts("   --damping_fp : fixed point damping parameter");
            puts("   --damping_aa : Anderson acceleration damping parameter");
            puts("   --orth_aa    : Anderson acceleration orthogonalization method");
            local_ac = 0xffffffff;
            goto LAB_00101517;
          }
          local_a8 = (FILE *)atof(argv[lVar7 + 1]);
        }
      }
LAB_001014da:
    }
    local_ac = 0;
LAB_00101517:
    iVar5 = check_retval(&local_ac,"ReadInputs",1);
    uVar6 = 1;
    if (iVar5 == 0) {
      puts("Solve the nonlinear system:");
      puts("    3x - cos((y-1)z) - 1/2 = 0");
      puts("    x^2 - 81(y-0.9)^2 + sin(z) + 1.06 = 0");
      puts("    exp(-x(y-1)) + 20z + (10 pi - 3)/3 = 0");
      puts("Analytic solution:");
      printf("    x = %g\n",0);
      printf("    y = %g\n",0);
      printf("    z = %g\n",0x382d7370);
      puts("Solution method: Anderson accelerated fixed point iteration.");
      printf("    tolerance    = %g\n",(undefined4)local_88);
      printf("    max iters    = %ld\n",local_58);
      printf("    m_aa         = %ld\n",local_70);
      printf("    delay_aa     = %ld\n",local_68);
      printf("    damping_aa   = %g\n",(int)local_a8);
      printf("    damping_fp   = %g\n",SUB84(local_98,0));
      printf("    orth routine = %d\n",(ulong)local_9c);
      local_ac = SUNContext_Create(0,&sunctx);
      uVar6 = 1;
      iVar5 = check_retval(&local_ac,"SUNContext_Create",1);
      if (iVar5 == 0) {
        returnvalue = (void *)N_VNew_Serial(3,sunctx);
        iVar5 = check_retval(returnvalue,"N_VNew_Serial",0);
        if (iVar5 == 0) {
          returnvalue_00 = (void *)N_VClone(returnvalue);
          iVar5 = check_retval(returnvalue_00,"N_VClone",0);
          if (iVar5 == 0) {
            returnvalue_01 = (void *)KINCreate(sunctx);
            kmem = returnvalue_01;
            iVar5 = check_retval(returnvalue_01,"KINCreate",0);
            if (iVar5 == 0) {
              local_ac = KINSetMAA(returnvalue_01,local_70);
              local_ac = KINSetOrthAA(returnvalue_01,local_9c);
              iVar5 = check_retval(&local_ac,"KINSetOrthAA",1);
              uVar6 = 1;
              if (iVar5 == 0) {
                local_ac = KINInit(returnvalue_01,FPFunction,returnvalue);
                iVar5 = check_retval(&local_ac,"KINInit",1);
                uVar6 = 1;
                if (iVar5 == 0) {
                  local_ac = KINSetFuncNormTol((undefined4)local_88,returnvalue_01);
                  iVar5 = check_retval(&local_ac,"KINSetFuncNormTol",1);
                  uVar6 = 1;
                  if (iVar5 == 0) {
                    local_ac = KINSetNumMaxIters(returnvalue_01,local_58);
                    uVar6 = 1;
                    iVar5 = check_retval(&local_ac,"KINSetNumMaxItersFuncNormTol",1);
                    if (iVar5 == 0) {
                      if (local_70 == 0) {
                        local_ac = KINSetDamping(SUB84(local_98,0),returnvalue_01);
                      }
                      else if (0 < local_70) {
                        local_ac = KINSetDampingAA((int)local_a8,returnvalue_01);
                        iVar5 = check_retval(&local_ac,"KINSetDampingAA",1);
                        if (iVar5 != 0) {
                          return 1;
                        }
                        local_ac = KINSetDelayAA(returnvalue_01,local_68);
                        iVar5 = check_retval(&local_ac,"KINSetDelayAA",1);
                        if (iVar5 != 0) {
                          return 1;
                        }
                      }
                      local_a8 = fopen("kinsol.log","w");
                      iVar5 = check_retval(local_a8,"fopen",0);
                      if (iVar5 == 0) {
                        returnvalue_02 = (undefined8 *)N_VGetArrayPointer(returnvalue);
                        iVar5 = check_retval(returnvalue_02,"N_VGetArrayPointer",0);
                        if (iVar5 == 0) {
                          *returnvalue_02 = 0x3fb999999999999a;
                          returnvalue_02[1] = 0x3fb999999999999a;
                          returnvalue_02[2] = 0xbfb999999999999a;
                          N_VConst(0,returnvalue_00);
                          local_ac = KINSol(returnvalue_01,returnvalue,3,returnvalue_00,
                                            returnvalue_00);
                          iVar5 = check_retval(&local_ac,"KINSol",1);
                          uVar6 = 1;
                          if (iVar5 == 0) {
                            local_ac = KINGetNumNonlinSolvIters(returnvalue_01,&nni);
                            uVar6 = 1;
                            check_retval(&local_ac,"KINGetNumNonlinSolvIters",1);
                            local_ac = KINGetNumFuncEvals(returnvalue_01,&nfe);
                            check_retval(&local_ac,"KINGetNumFuncEvals",1);
                            puts("\nFinal Statistics:");
                            printf("Number of nonlinear iterations: %6ld\n",nni);
                            printf("Number of function evaluations: %6ld\n",nfe);
                            returnvalue_03 = (double *)N_VGetArrayPointer(returnvalue);
                            iVar5 = check_retval(returnvalue_03,"N_VGetArrayPointer",0);
                            if (iVar5 == 0) {
                              puts("Computed solution:");
                              printf("    x = %g\n",SUB84(*returnvalue_03,0));
                              printf("    y = %g\n",SUB84(returnvalue_03[1],0));
                              printf("    z = %g\n",SUB84(returnvalue_03[2],0));
                              local_58 = ABS(*returnvalue_03 + -0.5);
                              uStack_50 = 0;
                              local_88 = local_88 * 10.0;
                              bVar3 = local_88 < local_58;
                              local_98 = ABS(returnvalue_03[1] + -1.0);
                              dStack_90 = ABS(returnvalue_03[2] + 0.5235987755983);
                              puts("Solution error:");
                              printf("    ex = %g\n",local_58._0_4_);
                              printf("    ey = %g\n",local_98._0_4_);
                              iVar5 = printf("    ez = %g\n",dStack_90._0_4_);
                              auVar1._8_4_ = (int)-(ulong)(local_88 < dStack_90);
                              auVar1._0_8_ = -(ulong)(local_88 < local_98);
                              auVar1._12_4_ = (int)(-(ulong)(local_88 < dStack_90) >> 0x20);
                              uVar6 = movmskpd(iVar5,auVar1);
                              bVar4 = ((byte)uVar6 & 2) >> 1;
                              pcVar8 = "PASS";
                              if (bVar4 != 0 || (bVar3 || (uVar6 & 1) != 0)) {
                                pcVar8 = "FAIL";
                              }
                              uVar6 = (byte)(bVar4 | bVar3 | (byte)uVar6) & 1;
                              puts(pcVar8);
                            }
                            local_ac = uVar6;
                            fclose(local_a8);
                            N_VDestroy(returnvalue);
                            N_VDestroy(returnvalue_00);
                            KINFree(&kmem);
                            SUNContext_Free(&sunctx);
                            uVar6 = local_ac;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return uVar6;
}

Assistant:

int main(int argc, char* argv[])
{
  SUNContext sunctx;
  int retval     = 0;    /* return value flag   */
  UserOpt uopt   = NULL; /* user options struct */
  N_Vector u     = NULL; /* solution vector     */
  N_Vector scale = NULL; /* scaling vector      */
  FILE* infofp   = NULL; /* KINSOL log file     */
  long int nni, nfe;     /* solver outputs      */
  sunrealtype* data;     /* vector data array   */
  void* kmem;            /* KINSOL memory       */

  /* Set default options */
  retval = SetDefaults(&uopt);
  if (check_retval(&retval, "SetDefaults", 1)) { return (1); }

  retval = ReadInputs(&argc, &argv, uopt);
  if (check_retval(&retval, "ReadInputs", 1))
  {
    free(uopt);
    return (1);
  }

  /* -------------------------
   * Print problem description
   * ------------------------- */

  printf("Solve the nonlinear system:\n");
  printf("    3x - cos((y-1)z) - 1/2 = 0\n");
  printf("    x^2 - 81(y-0.9)^2 + sin(z) + 1.06 = 0\n");
  printf("    exp(-x(y-1)) + 20z + (10 pi - 3)/3 = 0\n");
  printf("Analytic solution:\n");
  printf("    x = %" GSYM "\n", XTRUE);
  printf("    y = %" GSYM "\n", YTRUE);
  printf("    z = %" GSYM "\n", ZTRUE);
  printf("Solution method: Anderson accelerated fixed point iteration.\n");
  printf("    tolerance    = %" GSYM "\n", uopt->tol);
  printf("    max iters    = %ld\n", uopt->maxiter);
  printf("    m_aa         = %ld\n", uopt->m_aa);
  printf("    delay_aa     = %ld\n", uopt->delay_aa);
  printf("    damping_aa   = %" GSYM "\n", uopt->damping_aa);
  printf("    damping_fp   = %" GSYM "\n", uopt->damping_fp);
  printf("    orth routine = %d\n", uopt->orth_aa);

  /* Create the SUNDIALS context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* --------------------------------------
   * Create vectors for solution and scales
   * -------------------------------------- */

  u = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)u, "N_VNew_Serial", 0)) { return (1); }

  scale = N_VClone(u);
  if (check_retval((void*)scale, "N_VClone", 0)) { return (1); }

  /* -----------------------------------------
   * Initialize and allocate memory for KINSOL
   * ----------------------------------------- */

  kmem = KINCreate(sunctx);
  if (check_retval((void*)kmem, "KINCreate", 0)) { return (1); }

  /* Set number of prior residuals used in Anderson acceleration */
  retval = KINSetMAA(kmem, uopt->m_aa);

  /* Set orthogonalization routine used in Anderson acceleration */
  retval = KINSetOrthAA(kmem, uopt->orth_aa);
  if (check_retval(&retval, "KINSetOrthAA", 1)) { return (1); }

  retval = KINInit(kmem, FPFunction, u);
  if (check_retval(&retval, "KINInit", 1)) { return (1); }

  /* -------------------
   * Set optional inputs
   * ------------------- */

  /* Specify stopping tolerance based on residual */
  retval = KINSetFuncNormTol(kmem, uopt->tol);
  if (check_retval(&retval, "KINSetFuncNormTol", 1)) { return (1); }

  /* Set maximum number of iterations */
  retval = KINSetNumMaxIters(kmem, uopt->maxiter);
  if (check_retval(&retval, "KINSetNumMaxItersFuncNormTol", 1)) { return (1); }

  /* Set Fixed point damping parameter */
  if (uopt->m_aa == 0) { retval = KINSetDamping(kmem, uopt->damping_fp); }

  /* Set Anderson acceleration options */
  if (uopt->m_aa > 0)
  {
    /* Set damping parameter */
    retval = KINSetDampingAA(kmem, uopt->damping_aa);
    if (check_retval(&retval, "KINSetDampingAA", 1)) { return (1); }

    /* Set acceleration delay */
    retval = KINSetDelayAA(kmem, uopt->delay_aa);
    if (check_retval(&retval, "KINSetDelayAA", 1)) { return (1); }
  }

  /* Set info log file and print level */
  infofp = fopen("kinsol.log", "w");
  if (check_retval((void*)infofp, "fopen", 0)) { return (1); }

  /* -------------
   * Initial guess
   * ------------- */

  /* Get vector data array */
  data = N_VGetArrayPointer(u);
  if (check_retval((void*)data, "N_VGetArrayPointer", 0)) { return (1); }

  data[0] = PTONE;
  data[1] = PTONE;
  data[2] = -PTONE;

  /* ----------------------------
   * Call KINSol to solve problem
   * ---------------------------- */

  /* No scaling used */
  N_VConst(ONE, scale);

  /* Call main solver */
  retval = KINSol(kmem,   /* KINSol memory block */
                  u,      /* initial guess on input; solution vector */
                  KIN_FP, /* global strategy choice */
                  scale,  /* scaling vector, for the variable cc */
                  scale); /* scaling vector for function values fval */
  if (check_retval(&retval, "KINSol", 1)) { return (1); }

  /* ------------------------------------
   * Get solver statistics
   * ------------------------------------ */

  /* get solver stats */
  retval = KINGetNumNonlinSolvIters(kmem, &nni);
  check_retval(&retval, "KINGetNumNonlinSolvIters", 1);

  retval = KINGetNumFuncEvals(kmem, &nfe);
  check_retval(&retval, "KINGetNumFuncEvals", 1);

  printf("\nFinal Statistics:\n");
  printf("Number of nonlinear iterations: %6ld\n", nni);
  printf("Number of function evaluations: %6ld\n", nfe);

  /* ------------------------------------
   * Print solution and check error
   * ------------------------------------ */

  /* check solution */
  retval = check_ans(u, uopt->tol);

  /* -----------
   * Free memory
   * ----------- */

  fclose(infofp);
  N_VDestroy(u);
  N_VDestroy(scale);
  KINFree(&kmem);
  free(uopt);
  SUNContext_Free(&sunctx);

  return (retval);
}